

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

bool __thiscall Kernel::Clause::skip(Clause *this)

{
  bool bVar1;
  uint uVar2;
  Clause *in_RDI;
  Literal *lit;
  uint i;
  uint clen;
  Term *in_stack_00000078;
  uint local_18;
  
  uVar2 = length(in_RDI);
  local_18 = 0;
  while( true ) {
    if (uVar2 <= local_18) {
      return true;
    }
    operator[](in_RDI,local_18);
    bVar1 = Term::skip(in_stack_00000078);
    if (!bVar1) break;
    local_18 = local_18 + 1;
  }
  return false;
}

Assistant:

bool Clause::skip() const
{
  unsigned clen = length();
  for(unsigned i = 0; i < clen; i++) {
    const Literal* lit = (*this)[i];
    if (!lit->skip()) {
      return false;
    }
  }
  return true;
}